

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O0

int run_test_timer_null_callback(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_timer_t handle;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
            ,0x170,"uv_timer_init(uv_default_loop(), &handle)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_timer_start(&eval_a,0,100);
  if ((long)iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
            ,0x171,"UV_EINVAL","==","uv_timer_start(&handle, ((void*)0), 100, 100)",
            0xffffffffffffffea,"==",(long)iVar1);
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
            ,0x173,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(timer_null_callback) {
  uv_timer_t handle;

  ASSERT_OK(uv_timer_init(uv_default_loop(), &handle));
  ASSERT_EQ(UV_EINVAL, uv_timer_start(&handle, NULL, 100, 100));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}